

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBConstraintsInit(ClientContext *context,TableFunctionInitInput *input)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> _Var5;
  ulong uVar6;
  pointer pDVar7;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  long lVar8;
  undefined8 *puVar9;
  pointer prVar10;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> entries;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> local_a0;
  undefined8 *local_98;
  undefined8 *puStack_90;
  undefined8 local_88;
  undefined8 **local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> local_58;
  pointer local_50;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_48;
  
  _Var5._M_head_impl = (DuckDBConstraintsData *)operator_new(0x70);
  ((_Var5._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBConstraintsData_02452a88;
  ((_Var5._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var5._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var5._M_head_impl)->entries).
  super_vector<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>.
  super__Vector_base<duckdb::ConstraintEntry,_std::allocator<duckdb::ConstraintEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var5._M_head_impl)->offset = 0;
  (_Var5._M_head_impl)->constraint_offset = 0;
  (_Var5._M_head_impl)->unique_constraint_offset = 0;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_buckets =
       &((_Var5._M_head_impl)->constraint_names)._M_h._M_single_bucket;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_bucket_count = 1;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_element_count = 0;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_rehash_policy._M_next_resize = 0;
  ((_Var5._M_head_impl)->constraint_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_head_impl = _Var5._M_head_impl;
  Catalog::GetAllSchemas(&local_48,(ClientContext *)input);
  local_50 = local_48.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar10 = local_48.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58._M_head_impl = (GlobalTableFunctionState *)context;
    do {
      local_98 = (undefined8 *)0x0;
      puStack_90 = (undefined8 *)0x0;
      local_88 = 0;
      local_70 = 0;
      local_78 = &local_98;
      local_60 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
                 ::_M_invoke;
      local_68 = ::std::
                 _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
                 ::_M_manager;
      (*(prVar10->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (prVar10->_M_data,input,1,&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      puVar4 = puStack_90;
      puVar2 = local_98;
      puVar3 = puStack_90;
      if (local_98 != puStack_90) {
        lVar8 = (long)puStack_90 - (long)local_98;
        uVar6 = lVar8 >> 3;
        lVar1 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                  (local_98,puStack_90,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar8 < 0x81) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                    (puVar2,puVar4);
          puVar2 = local_98;
          puVar3 = puStack_90;
        }
        else {
          puVar9 = puVar2 + 0x10;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                    (puVar2,puVar9);
          for (; puVar2 = local_98, puVar3 = puStack_90, puVar9 != puVar4; puVar9 = puVar9 + 1) {
            ::std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                      (puVar9);
          }
        }
      }
      for (; puVar4 = puStack_90, puVar2 != puStack_90; puVar2 = puVar2 + 1) {
        puStack_90 = puVar3;
        pDVar7 = unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                 ::operator->((unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                               *)&local_a0);
        ::std::vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>>::
        emplace_back<duckdb::ClientContext&,duckdb::TableCatalogEntry&>
                  ((vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>> *)
                   &pDVar7->entries,(ClientContext *)input,(TableCatalogEntry *)*puVar2);
        puVar3 = puStack_90;
        puStack_90 = puVar4;
      }
      puStack_90 = puVar3;
      if (local_98 != (undefined8 *)0x0) {
        operator_delete(local_98);
      }
      prVar10 = prVar10 + 1;
      context = (ClientContext *)local_58._M_head_impl;
      _Var5._M_head_impl = local_a0._M_head_impl;
    } while (prVar10 != local_50);
  }
  local_a0._M_head_impl = (DuckDBConstraintsData *)0x0;
  *(DuckDBConstraintsData **)context = _Var5._M_head_impl;
  if ((local_48.
       super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
     (operator_delete(local_48.
                      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start),
     local_a0._M_head_impl != (DuckDBConstraintsData *)0x0)) {
    (*((local_a0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBConstraintsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBConstraintsData>();

	// scan all the schemas for tables and collect them
	auto schemas = Catalog::GetAllSchemas(context);

	for (auto &schema : schemas) {
		vector<reference<CatalogEntry>> entries;

		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				entries.push_back(entry);
			}
		});

		sort(entries.begin(), entries.end(), [&](CatalogEntry &x, CatalogEntry &y) { return (x.name < y.name); });
		for (auto &entry : entries) {
			result->entries.emplace_back(context, entry.get().Cast<TableCatalogEntry>());
		}
	};

	return std::move(result);
}